

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstack.cc
# Opt level: O0

int anon_unknown.dwarf_18341::usage(ostream *os,char *name,Flags *options)

{
  ostream *poVar1;
  Flags *options_local;
  char *name_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"usage: ");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1,
                           " <[ exe ] <PID | core> >+\n\nprint a stack trace of PID or core. If specified, assume image was created from\n execing `exe`, otherwise, the executable is inferred from the process or core\n\navailable options:\n"
                          );
  poVar1 = operator<<(poVar1,options);
  std::operator<<(poVar1,"\n");
  return 0x40;
}

Assistant:

int
usage(std::ostream &os, const char *name, const Flags &options)
{
     os <<
"usage: " << name << " <[ exe ] <PID | core> >+\n"
"\n"
"print a stack trace of PID or core. If specified, assume image was created from\n"
" execing `exe`, otherwise, the executable is inferred from the process or core\n"
"\n"
"available options:\n" << options <<  "\n";
     return EX_USAGE;
}